

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addImageOperations(GLES2ThreadedSharingTest *this)

{
  value_type pEVar1;
  bool bVar2;
  reference ppEVar3;
  InitGLExtension *pIVar4;
  CreateShader *pCVar5;
  ShaderSource *pSVar6;
  ShaderCompile *pSVar7;
  CreateProgram *this_00;
  AttachShader *pAVar8;
  LinkProgram *this_01;
  CreateTexture *pCVar9;
  TexImage2D *pTVar10;
  CreateImageFromTexture *pCVar11;
  DefineTextureFromImage *pDVar12;
  DeleteTexture *pDVar13;
  TexSubImage2D *pTVar14;
  CopyTexSubImage2D *pCVar15;
  CopyTexImage2D *pCVar16;
  RenderTexture *pRVar17;
  ReadPixels *pRVar18;
  CompareData *this_02;
  DestroyImage *pDVar19;
  DeleteShader *pDVar20;
  DeleteProgram *this_03;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_418;
  undefined1 local_401;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_400;
  undefined1 local_3e9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_3e8;
  undefined1 local_3d1;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_3d0;
  undefined1 local_3b9;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_3b8;
  undefined1 local_3a1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_3a0;
  undefined1 local_389;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_388;
  undefined1 local_371;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_370;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_360;
  undefined1 local_349;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_348;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_338;
  undefined1 local_321;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_320;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_310;
  undefined1 local_300 [8];
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_2d8;
  undefined1 local_2c1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_2c0;
  undefined1 local_2a9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_2a8;
  undefined1 local_291;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_290;
  undefined1 local_279;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_278;
  undefined1 local_261;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_260;
  undefined1 local_249;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_248;
  undefined1 local_231;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_230;
  undefined1 local_219;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_218;
  undefined1 local_201;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_200;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1f0;
  undefined1 local_1d9;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_1d8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1c8;
  undefined1 local_1b1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1b0;
  undefined1 local_199;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_198;
  undefined1 local_181;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_180;
  undefined1 local_169;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_168;
  undefined1 local_158 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> image;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> texture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> sourceTexture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_120;
  undefined1 local_109;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_f8;
  undefined1 local_e1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_d0;
  undefined1 local_b9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_b8;
  undefined1 local_a1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_a0;
  undefined1 local_89;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_88;
  undefined1 local_71;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_70;
  char *local_60;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  undefined1 local_30 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  GLES2ThreadedSharingTest *this_local;
  
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
  ppEVar3 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar3;
  pIVar4 = (InitGLExtension *)operator_new(0x58);
  GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar4,"GL_OES_EGL_image");
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pIVar4);
  ppEVar3 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,1);
  pEVar1 = *ppEVar3;
  pIVar4 = (InitGLExtension *)operator_new(0x58);
  GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar4,"GL_OES_EGL_image");
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pIVar4);
  if (((this->m_config).render & 1U) != 0) {
    fragmentShaderSource =
         "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
    ;
    local_60 = 
    "varying mediump vec2 v_pos;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_pos);\n}\n"
    ;
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pCVar5 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar5,0x8b31,
               (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar5);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pSVar6 = (ShaderSource *)operator_new(0x98);
    local_71 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_70,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar6,&local_70,fragmentShaderSource,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_71 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_70);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pSVar7 = (ShaderCompile *)operator_new(0x78);
    local_89 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_88,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar7,&local_88,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_89 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar7);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_88);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pCVar5 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar5,0x8b30,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar5);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pSVar6 = (ShaderSource *)operator_new(0x98);
    local_a1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_a0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar6,&local_a0,local_60,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_a1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_a0);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pSVar7 = (ShaderCompile *)operator_new(0x78);
    local_b9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_b8,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar7,&local_b8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_b9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar7);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_b8);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    this_00 = (CreateProgram *)operator_new(0x78);
    GLES2ThreadTest::CreateProgram::CreateProgram
              (this_00,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pAVar8 = (AttachShader *)operator_new(0x88);
    local_e1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_d0,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_e0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar8,&local_d0,&local_e0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_e1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar8);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_e0);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_d0);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pAVar8 = (AttachShader *)operator_new(0x88);
    local_109 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_f8,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_108,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar8,&local_f8,&local_108,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_109 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar8);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_108);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_f8);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    this_01 = (LinkProgram *)operator_new(0x78);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_120,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    GLES2ThreadTest::LinkProgram::LinkProgram
              (this_01,&local_120,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_01);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_120);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&texture.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158);
  ppEVar3 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar3;
  pCVar9 = (CreateTexture *)operator_new(0x78);
  GLES2ThreadTest::CreateTexture::CreateTexture
            (pCVar9,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&texture.m_state,
             (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar9);
  ppEVar3 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar3;
  pTVar10 = (TexImage2D *)operator_new(0x90);
  local_169 = 1;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
            (&local_168,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&texture.m_state);
  GLES2ThreadTest::TexImage2D::TexImage2D
            (pTVar10,&local_168,0,0x1908,0x100,0x100,0x1908,0x1401,
             (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
  local_169 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar10);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_168);
  if ((this->m_config).define == 1) {
    if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar3;
      pCVar11 = (CreateImageFromTexture *)operator_new(0x88);
      local_199 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_198,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&texture.m_state);
      GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
                (pCVar11,(SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158,&local_198,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_199 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar11);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_198);
    }
    else {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar3;
      pCVar11 = (CreateImageFromTexture *)operator_new(0x88);
      local_181 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_180,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&texture.m_state);
      GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
                (pCVar11,(SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158,&local_180,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_181 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar11);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_180);
    }
  }
  if ((this->m_config).define == 2) {
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pCVar11 = (CreateImageFromTexture *)operator_new(0x88);
    local_1b1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
              (&local_1b0,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&texture.m_state);
    GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
              (pCVar11,(SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158,&local_1b0,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    local_1b1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar11);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_1b0);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pCVar9 = (CreateTexture *)operator_new(0x78);
    GLES2ThreadTest::CreateTexture::CreateTexture
              (pCVar9,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar9);
    if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar3;
      pDVar12 = (DefineTextureFromImage *)operator_new(0x88);
      local_201 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_1f0,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr
                (&local_200,(SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158);
      GLES2ThreadTest::DefineTextureFromImage::DefineTextureFromImage
                (pDVar12,&local_1f0,&local_200,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_201 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar12);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::~SharedPtr(&local_200);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_1f0);
    }
    else {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar3;
      pDVar12 = (DefineTextureFromImage *)operator_new(0x88);
      local_1d9 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_1c8,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr
                (&local_1d8,(SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158);
      GLES2ThreadTest::DefineTextureFromImage::DefineTextureFromImage
                (pDVar12,&local_1c8,&local_1d8,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_1d9 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar12);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::~SharedPtr(&local_1d8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_1c8);
    }
  }
  ppEVar3 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar3;
  pDVar13 = (DeleteTexture *)operator_new(0x78);
  local_219 = 1;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
            (&local_218,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&texture.m_state);
  GLES2ThreadTest::DeleteTexture::DeleteTexture
            (pDVar13,&local_218,(bool)((this->m_config).useFenceSync & 1),
             (bool)((this->m_config).serverSync & 1));
  local_219 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_218);
  if ((this->m_config).modify == 1) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar3;
      pTVar14 = (TexSubImage2D *)operator_new(0x98);
      local_249 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_248,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar14,&local_248,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_249 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar14);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_248);
    }
    else {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar3;
      pTVar14 = (TexSubImage2D *)operator_new(0x98);
      local_231 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_230,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar14,&local_230,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_231 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar14);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_230);
    }
  }
  if ((this->m_config).modify == 2) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar3;
      pCVar15 = (CopyTexSubImage2D *)operator_new(0x98);
      local_279 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_278,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar15,&local_278,0,7,7,0x11,0x11,0x1d,0x1d,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_279 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar15);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_278);
    }
    else {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar3;
      pCVar15 = (CopyTexSubImage2D *)operator_new(0x98);
      local_261 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_260,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar15,&local_260,0,7,7,0x11,0x11,0x1d,0x1d,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_261 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar15);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_260);
    }
  }
  if ((this->m_config).modify == 3) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar3;
      pTVar10 = (TexImage2D *)operator_new(0x90);
      local_2a9 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_2a8,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar10,&local_2a8,0,0x1908,0x100,0x100,0x1908,0x1401,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_2a9 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar10);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_2a8);
    }
    else {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar3;
      pTVar10 = (TexImage2D *)operator_new(0x90);
      local_291 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_290,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar10,&local_290,0,0x1908,0x100,0x100,0x1908,0x1401,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_291 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar10);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_290);
    }
  }
  if ((this->m_config).modify == 4) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar3;
      pCVar16 = (CopyTexImage2D *)operator_new(0x98);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_2d8,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar16,&local_2d8,0,0x1908,7,7,0x100,0x100,0,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar16);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_2d8);
    }
    else {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar3;
      pCVar16 = (CopyTexImage2D *)operator_new(0x98);
      local_2c1 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_2c0,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar16,&local_2c0,0,0x1908,7,7,0x100,0x100,0,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_2c1 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar16);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_2c0);
    }
  }
  if (((this->m_config).render & 1U) != 0) {
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)local_300);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pRVar17 = (RenderTexture *)operator_new(0x88);
    local_321 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_310,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
              (&local_320,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar17,&local_310,&local_320,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_321 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar17);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_320);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_310);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar3;
    pRVar17 = (RenderTexture *)operator_new(0x88);
    local_349 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_338,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
              (&local_348,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar17,&local_338,&local_348,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_349 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar17);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_348);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_338);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pRVar18 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar18,0,0,400,400,0x1908,0x1401,
               (SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar18);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar3;
    pRVar18 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar18,0,0,400,400,0x1908,0x1401,(SharedPtr<tcu::ThreadUtil::DataBlock> *)local_300,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar18);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    this_02 = (CompareData *)operator_new(0x58);
    local_371 = 1;
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              (&local_360,(SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              (&local_370,(SharedPtr<tcu::ThreadUtil::DataBlock> *)local_300);
    tcu::ThreadUtil::CompareData::CompareData(this_02,&local_360,&local_370);
    local_371 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_02);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr(&local_370);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr(&local_360);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)local_300);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
  }
  bVar2 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&image.m_state);
  if (bVar2) {
    if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar3;
      pDVar13 = (DeleteTexture *)operator_new(0x78);
      local_3a1 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_3a0,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::DeleteTexture::DeleteTexture
                (pDVar13,&local_3a0,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_3a1 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_3a0);
    }
    else {
      ppEVar3 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar3;
      pDVar13 = (DeleteTexture *)operator_new(0x78);
      local_389 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_388,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
      GLES2ThreadTest::DeleteTexture::DeleteTexture
                (pDVar13,&local_388,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_389 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_388);
    }
  }
  if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar3;
    pDVar19 = (DestroyImage *)operator_new(0x78);
    local_3d1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr
              (&local_3d0,(SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158);
    GLES2ThreadTest::DestroyImage::DestroyImage
              (pDVar19,&local_3d0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_3d1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar19);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::~SharedPtr(&local_3d0);
  }
  else {
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pDVar19 = (DestroyImage *)operator_new(0x78);
    local_3b9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr
              (&local_3b8,(SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158);
    GLES2ThreadTest::DestroyImage::DestroyImage
              (pDVar19,&local_3b8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_3b9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar19);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::~SharedPtr(&local_3b8);
  }
  if (((this->m_config).render & 1U) != 0) {
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pDVar20 = (DeleteShader *)operator_new(0x78);
    local_3e9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_3e8,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar20,&local_3e8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_3e9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar20);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_3e8);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    pDVar20 = (DeleteShader *)operator_new(0x78);
    local_401 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_400,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar20,&local_400,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_401 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar20);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_400);
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar3;
    this_03 = (DeleteProgram *)operator_new(0x78);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_418,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (this_03,&local_418,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_03);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_418);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)local_158);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&image.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)&texture.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addImageOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;
	SharedPtr<GLES2ThreadTest::Program>	program;

	m_threads[0]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_image"));
	m_threads[1]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_image"));

	if (m_config.render)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"uniform sampler2D u_sampler;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = texture2D(u_sampler, v_pos);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Texture>		sourceTexture;
	SharedPtr<GLES2ThreadTest::Texture>		texture;
	SharedPtr<GLES2ThreadTest::EGLImage>	image;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(sourceTexture, m_config.useFenceSync, m_config.serverSync));
	m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(sourceTexture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define == 1)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.define == 2)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(texture, m_config.useFenceSync, m_config.serverSync));

		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::DefineTextureFromImage(texture, image, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::DefineTextureFromImage(texture, image, m_config.useFenceSync, m_config.serverSync));
	}

	m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(sourceTexture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.modify == 1)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 3)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 4)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 7, 7, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 7, 7, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.render)
	{
		DE_ASSERT(m_config.define != 1);

		SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;

		m_threads[0]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels1, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels2, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new tcu::ThreadUtil::CompareData(pixels1, pixels2));
	}

	if (texture)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DestroyImage(image, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DestroyImage(image, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	}
}